

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void print_token(vector<Token,_std::allocator<Token>_> *v)

{
  Token *pTVar1;
  ostream *poVar2;
  Token *this;
  fstream f;
  string local_260;
  char local_240 [16];
  ostream local_230 [512];
  
  std::fstream::fstream(local_240);
  std::fstream::open(local_240,0x10d020);
  this = (v->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.super__Vector_impl_data.
         _M_start;
  pTVar1 = (v->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (this != pTVar1) {
    do {
      Token::to_string_abi_cxx11_(&local_260,this);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_230,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      this = this + 1;
    } while (this != pTVar1);
  }
  std::fstream::close();
  std::fstream::~fstream(local_240);
  return;
}

Assistant:

void print_token(const vector<Token> &v) {
    fstream f;
    f.open("token.txt", ios::out);
    for (const auto &it : v) {
        f << it.to_string() << endl;
    }
    f.close();
}